

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2Match(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  StringPiece *local_1110;
  LogMessage local_1108;
  LogMessage local_f88;
  LogMessage local_e08;
  LogMessage local_c88;
  int *local_b08;
  string *local_b00;
  string *local_af8;
  StringPiece local_af0;
  int local_adc;
  string local_ad8 [4];
  int port;
  string host;
  string local_ab8 [8];
  string all;
  LogMessage local_a98;
  StringPiece local_918;
  LogMessage local_908;
  StringPiece local_788;
  LogMessage local_778;
  StringPiece local_5f8;
  LogMessage local_5e8;
  StringPiece local_468;
  LogMessage local_458;
  StringPiece local_2d8;
  LogMessage local_2c8;
  undefined1 local_148 [8];
  StringPiece s;
  undefined1 local_128 [8];
  StringPiece group [4];
  RE2 re;
  
  RE2::RE2((RE2 *)&group[3].length_,"((\\w+):([0-9]+))");
  local_1110 = (StringPiece *)local_128;
  do {
    StringPiece::StringPiece(local_1110);
    local_1110 = local_1110 + 1;
  } while (local_1110 != (StringPiece *)&group[3].length_);
  StringPiece::StringPiece((StringPiece *)local_148,"zyzzyva");
  iVar2 = StringPiece::size((StringPiece *)local_148);
  bVar1 = RE2::Match((RE2 *)&group[3].length_,(StringPiece *)local_148,0,iVar2,UNANCHORED,
                     (StringPiece *)local_128,4);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2c8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x15f);
    poVar3 = LogMessage::stream(&local_2c8);
    std::operator<<(poVar3,
                    "Check failed: !re.Match(s, 0, s.size(), RE2::UNANCHORED, group, arraysize(group))"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2c8);
  }
  StringPiece::StringPiece(&local_2d8,"a chrisr:9000 here");
  s.ptr_._0_4_ = local_2d8.length_;
  local_148 = (undefined1  [8])local_2d8.ptr_;
  iVar2 = StringPiece::size((StringPiece *)local_148);
  bVar1 = RE2::Match((RE2 *)&group[3].length_,(StringPiece *)local_148,0,iVar2,UNANCHORED,
                     (StringPiece *)local_128,4);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_458,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x164);
    poVar3 = LogMessage::stream(&local_458);
    std::operator<<(poVar3,
                    "Check failed: re.Match(s, 0, s.size(), RE2::UNANCHORED, group, arraysize(group))"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_458);
  }
  StringPiece::StringPiece(&local_468,"chrisr:9000");
  bVar1 = operator==((StringPiece *)local_128,&local_468);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_5e8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x165);
    poVar3 = LogMessage::stream(&local_5e8);
    std::operator<<(poVar3,"Check failed: (group[0]) == (\"chrisr:9000\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_5e8);
  }
  StringPiece::StringPiece(&local_5f8,"chrisr:9000");
  bVar1 = operator==((StringPiece *)&group[0].length_,&local_5f8);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_778,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x166);
    poVar3 = LogMessage::stream(&local_778);
    std::operator<<(poVar3,"Check failed: (group[1]) == (\"chrisr:9000\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_778);
  }
  StringPiece::StringPiece(&local_788,"chrisr");
  bVar1 = operator==((StringPiece *)&group[1].length_,&local_788);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_908,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x167);
    poVar3 = LogMessage::stream(&local_908);
    std::operator<<(poVar3,"Check failed: (group[2]) == (\"chrisr\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_908);
  }
  StringPiece::StringPiece(&local_918,"9000");
  bVar1 = operator==((StringPiece *)&group[2].length_,&local_918);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_a98,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x168);
    poVar3 = LogMessage::stream(&local_a98);
    std::operator<<(poVar3,"Check failed: (group[3]) == (\"9000\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_a98);
  }
  std::__cxx11::string::string(local_ab8);
  std::__cxx11::string::string(local_ad8);
  StringPiece::StringPiece(&local_af0,"a chrisr:9000 here");
  local_af8 = local_ab8;
  local_b00 = local_ad8;
  local_b08 = &local_adc;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*,int*>
                    (&local_af0,(RE2 *)&group[3].length_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_af8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_b00,&local_b08);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_c88,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x16c);
    poVar3 = LogMessage::stream(&local_c88);
    std::operator<<(poVar3,
                    "Check failed: RE2::PartialMatch(\"a chrisr:9000 here\", re, &all, &host, &port)"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_c88);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_ab8,"chrisr:9000");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_e08,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x16d);
    poVar3 = LogMessage::stream(&local_e08);
    std::operator<<(poVar3,"Check failed: (all) == (\"chrisr:9000\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_e08);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_ad8,"chrisr");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_f88,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x16e);
    poVar3 = LogMessage::stream(&local_f88);
    std::operator<<(poVar3,"Check failed: (host) == (\"chrisr\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_f88);
  }
  if (local_adc != 9000) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1108,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x16f);
    poVar3 = LogMessage::stream(&local_1108);
    std::operator<<(poVar3,"Check failed: (port) == (9000)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1108);
  }
  std::__cxx11::string::~string(local_ad8);
  std::__cxx11::string::~string(local_ab8);
  RE2::~RE2((RE2 *)&group[3].length_);
  return;
}

Assistant:

TEST(RE2, Match) {
  RE2 re("((\\w+):([0-9]+))");   // extracts host and port
  StringPiece group[4];

  // No match.
  StringPiece s = "zyzzyva";
  CHECK(!re.Match(s, 0, s.size(), RE2::UNANCHORED,
                  group, arraysize(group)));

  // Matches and extracts.
  s = "a chrisr:9000 here";
  CHECK(re.Match(s, 0, s.size(), RE2::UNANCHORED,
                 group, arraysize(group)));
  CHECK_EQ(group[0], "chrisr:9000");
  CHECK_EQ(group[1], "chrisr:9000");
  CHECK_EQ(group[2], "chrisr");
  CHECK_EQ(group[3], "9000");

  string all, host;
  int port;
  CHECK(RE2::PartialMatch("a chrisr:9000 here", re, &all, &host, &port));
  CHECK_EQ(all, "chrisr:9000");
  CHECK_EQ(host, "chrisr");
  CHECK_EQ(port, 9000);
}